

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

cf_bool_t cf_lite_queue_push_back(cf_lite_queue_t *self,void *data)

{
  undefined1 auVar1 [16];
  cf_bool_t cVar2;
  cf_size_t cVar3;
  long lVar4;
  
  cVar2 = 0;
  if (data != (void *)0x0) {
    cVar3 = self->count;
    if (cVar3 == self->capacity) {
      cVar2 = cf_lite_queue_extend(self);
      if (cVar2 == 0) {
        return 0;
      }
      cVar3 = self->count;
    }
    if (cVar3 == 0) {
      self->head = 0;
      self->tail = 0;
      lVar4 = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = self->capacity;
      auVar1 = ZEXT416(self->tail + 1) % auVar1;
      lVar4 = auVar1._0_8_;
      self->tail = auVar1._0_4_;
    }
    cVar3 = self->elm_size;
    cf_memcpy_s((cf_void_t *)(lVar4 * cVar3 + (long)self->items),cVar3,data,cVar3);
    self->count = self->count + 1;
    cVar2 = 1;
  }
  return cVar2;
}

Assistant:

cf_bool_t cf_lite_queue_push_back(cf_lite_queue_t* self, void* data) {
    if (!data) {
        return CF_FALSE;
    }

    if (self->count == self->capacity) {
        if (!cf_lite_queue_extend(self)) {
            return CF_FALSE;
        }
    }

    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->tail = (self->tail + 1) % self->capacity;
    }
    cf_memcpy_s((void*)&((((cf_uint8_t*)(self->items))[self->elm_size * self->tail])), \
        self->elm_size, data, self->elm_size);
    self->count++;
    return CF_TRUE;
}